

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seed_gen_exception.cc
# Opt level: O0

void absl::lts_20240722::random_internal::ThrowSeedGenException(void)

{
  SeedGenException *this;
  
  this = (SeedGenException *)__cxa_allocate_exception(8);
  memset(this,0,8);
  SeedGenException::SeedGenException(this);
  __cxa_throw(this,&SeedGenException::typeinfo,SeedGenException::~SeedGenException);
}

Assistant:

void ThrowSeedGenException() {
#ifdef ABSL_HAVE_EXCEPTIONS
  throw absl::SeedGenException();
#else
  std::cerr << kExceptionMessage << std::endl;
  std::terminate();
#endif
}